

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult
anon_unknown.dwarf_4ca4bc::ConditionHelper
          (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           *out,Value *value)

{
  EqualsCondition *pEVar1;
  Condition *pCVar2;
  bool bVar3;
  Value *pVVar4;
  pointer __p;
  ReadFileResult unaff_EBP;
  Condition *pCVar5;
  EqualsCondition *local_70;
  Condition *local_68;
  String type;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_40;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_38;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_30;
  
  pEVar1 = local_70;
  if (value == (Value *)0x0) {
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = (Condition *)0x0;
    if (pCVar5 != (Condition *)0x0) {
      (*pCVar5->_vptr_Condition[1])();
      return READ_OK;
    }
    return READ_OK;
  }
  bVar3 = Json::Value::isBool(value);
  if (bVar3) {
    std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    bVar3 = Json::Value::asBool(value);
    type._M_dataplus._M_p[8] = bVar3;
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
         (Condition *)type._M_dataplus._M_p;
LAB_001ee1fa:
    type._M_dataplus._M_p = (pointer)0x0;
    if ((pCVar5 != (Condition *)0x0) &&
       ((*pCVar5->_vptr_Condition[1])(), type._M_dataplus._M_p != (pointer)0x0)) {
      (**(code **)(*(long *)type._M_dataplus._M_p + 8))();
    }
    return READ_OK;
  }
  bVar3 = Json::Value::isNull(value);
  if (bVar3) {
    std::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
         (Condition *)type._M_dataplus._M_p;
    goto LAB_001ee1fa;
  }
  bVar3 = Json::Value::isObject(value);
  if (!bVar3) {
    return INVALID_CONDITION;
  }
  bVar3 = Json::Value::isMember(value,"type");
  if (!bVar3) {
    return INVALID_CONDITION;
  }
  pVVar4 = Json::Value::operator[](value,"type");
  bVar3 = Json::Value::isString(pVVar4);
  if (!bVar3) {
    return INVALID_CONDITION;
  }
  pVVar4 = Json::Value::operator[](value,"type");
  Json::Value::asString_abi_cxx11_(&type,pVVar4);
  bVar3 = std::operator==(&type,"const");
  if (bVar3) {
    std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    unaff_EBP = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                Object<cmCMakePresetsGraphInternal::ConstCondition>::operator()
                          ((Object<cmCMakePresetsGraphInternal::ConstCondition> *)
                           (anonymous_namespace)::ConstConditionHelper,(ConstCondition *)local_70,
                           value);
LAB_001ee2b6:
    if (unaff_EBP != READ_OK) goto LAB_001ee5af;
    local_70 = (EqualsCondition *)0x0;
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
         &pEVar1->super_Condition;
    if (pCVar5 != (Condition *)0x0) {
      (*pCVar5->_vptr_Condition[1])();
      goto LAB_001ee5af;
    }
  }
  else {
    bVar3 = std::operator==(&type,"equals");
    if ((bVar3) || (bVar3 = std::operator==(&type,"notEquals"), bVar3)) {
      std::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
      unaff_EBP = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                  Object<cmCMakePresetsGraphInternal::EqualsCondition>::operator()
                            ((Object<cmCMakePresetsGraphInternal::EqualsCondition> *)
                             (anonymous_namespace)::EqualsConditionHelper,local_70,value);
      if (unaff_EBP == READ_OK) {
        local_70 = (EqualsCondition *)0x0;
        pCVar5 = (out->_M_t).
                 super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
        (out->_M_t).
        super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
        .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
             &pEVar1->super_Condition;
        if (pCVar5 != (Condition *)0x0) {
          (*pCVar5->_vptr_Condition[1])();
        }
        bVar3 = std::operator==(&type,"notEquals");
        if (bVar3) {
          local_30._M_head_impl =
               (out->_M_t).
               super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
               (Condition *)0x0;
          InvertCondition((anon_unknown_dwarf_4ca4bc *)&local_68,
                          (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           *)&local_30);
          pCVar2 = local_68;
          local_68 = (Condition *)0x0;
          pCVar5 = (out->_M_t).
                   super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar2;
          if ((pCVar5 != (Condition *)0x0) &&
             ((*pCVar5->_vptr_Condition[1])(), local_68 != (Condition *)0x0)) {
            (**(code **)(*(long *)local_68 + 8))();
          }
          local_68 = (Condition *)0x0;
          if (local_30._M_head_impl != (Condition *)0x0) {
            (*(local_30._M_head_impl)->_vptr_Condition[1])();
          }
          local_30._M_head_impl = (Condition *)0x0;
        }
      }
    }
    else {
      bVar3 = std::operator==(&type,"inList");
      if ((bVar3) || (bVar3 = std::operator==(&type,"notInList"), bVar3)) {
        std::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
        unaff_EBP = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                    Object<cmCMakePresetsGraphInternal::InListCondition>::operator()
                              ((Object<cmCMakePresetsGraphInternal::InListCondition> *)
                               (anonymous_namespace)::InListConditionHelper,
                               (InListCondition *)local_70,value);
        if (unaff_EBP == READ_OK) {
          local_70 = (EqualsCondition *)0x0;
          pCVar5 = (out->_M_t).
                   super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
               &pEVar1->super_Condition;
          if (pCVar5 != (Condition *)0x0) {
            (*pCVar5->_vptr_Condition[1])();
          }
          bVar3 = std::operator==(&type,"notInList");
          if (bVar3) {
            local_38._M_head_impl =
                 (out->_M_t).
                 super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
            (out->_M_t).
            super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                 (Condition *)0x0;
            InvertCondition((anon_unknown_dwarf_4ca4bc *)&local_68,
                            (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             *)&local_38);
            pCVar2 = local_68;
            local_68 = (Condition *)0x0;
            pCVar5 = (out->_M_t).
                     super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
            (out->_M_t).
            super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar2;
            if ((pCVar5 != (Condition *)0x0) &&
               ((*pCVar5->_vptr_Condition[1])(), local_68 != (Condition *)0x0)) {
              (**(code **)(*(long *)local_68 + 8))();
            }
            local_68 = (Condition *)0x0;
            if (local_38._M_head_impl != (Condition *)0x0) {
              (*(local_38._M_head_impl)->_vptr_Condition[1])();
            }
            local_38._M_head_impl = (Condition *)0x0;
          }
        }
      }
      else {
        bVar3 = std::operator==(&type,"matches");
        if ((!bVar3) && (bVar3 = std::operator==(&type,"notMatches"), !bVar3)) {
          bVar3 = std::operator==(&type,"anyOf");
          if ((bVar3) || (bVar3 = std::operator==(&type,"allOf"), bVar3)) {
            std::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
            bVar3 = std::operator==(&type,"anyOf");
            *(bool *)((long)(local_70->Lhs).field_2._M_local_buf + 8) = bVar3;
            unaff_EBP = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                        Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>::operator()
                                  ((Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *)
                                   (anonymous_namespace)::AnyAllOfConditionHelper,
                                   (AnyAllOfCondition *)local_70,value);
          }
          else {
            bVar3 = std::operator==(&type,"not");
            if (!bVar3) {
              bVar3 = true;
              goto LAB_001ee5c1;
            }
            std::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
            unaff_EBP = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                        Object<cmCMakePresetsGraphInternal::NotCondition>::operator()
                                  ((Object<cmCMakePresetsGraphInternal::NotCondition> *)
                                   (anonymous_namespace)::NotConditionHelper,
                                   (NotCondition *)local_70,value);
          }
          goto LAB_001ee2b6;
        }
        std::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
        unaff_EBP = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                    Object<cmCMakePresetsGraphInternal::MatchesCondition>::operator()
                              ((Object<cmCMakePresetsGraphInternal::MatchesCondition> *)
                               (anonymous_namespace)::MatchesConditionHelper,
                               (MatchesCondition *)local_70,value);
        if (unaff_EBP == READ_OK) {
          local_70 = (EqualsCondition *)0x0;
          pCVar5 = (out->_M_t).
                   super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
               &pEVar1->super_Condition;
          if (pCVar5 != (Condition *)0x0) {
            (*pCVar5->_vptr_Condition[1])();
          }
          bVar3 = std::operator==(&type,"notMatches");
          if (bVar3) {
            local_40._M_head_impl =
                 (out->_M_t).
                 super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
            (out->_M_t).
            super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                 (Condition *)0x0;
            InvertCondition((anon_unknown_dwarf_4ca4bc *)&local_68,
                            (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             *)&local_40);
            pCVar2 = local_68;
            local_68 = (Condition *)0x0;
            pCVar5 = (out->_M_t).
                     super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
            (out->_M_t).
            super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar2;
            if ((pCVar5 != (Condition *)0x0) &&
               ((*pCVar5->_vptr_Condition[1])(), local_68 != (Condition *)0x0)) {
              (**(code **)(*(long *)local_68 + 8))();
            }
            local_68 = (Condition *)0x0;
            if (local_40._M_head_impl != (Condition *)0x0) {
              (*(local_40._M_head_impl)->_vptr_Condition[1])();
            }
            local_40._M_head_impl = (Condition *)0x0;
          }
        }
      }
    }
LAB_001ee5af:
    if (local_70 != (EqualsCondition *)0x0) {
      (*(local_70->super_Condition)._vptr_Condition[1])();
    }
  }
  bVar3 = false;
LAB_001ee5c1:
  std::__cxx11::string::~string((string *)&type);
  if (bVar3) {
    return INVALID_CONDITION;
  }
  return unaff_EBP;
}

Assistant:

ReadFileResult ConditionHelper(
  std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  if (!value) {
    out.reset();
    return ReadFileResult::READ_OK;
  }

  if (value->isBool()) {
    auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    c->Value = value->asBool();
    out = std::move(c);
    return ReadFileResult::READ_OK;
  }

  if (value->isNull()) {
    out = cm::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    return ReadFileResult::READ_OK;
  }

  if (value->isObject()) {
    if (!value->isMember("type")) {
      return ReadFileResult::INVALID_CONDITION;
    }

    if (!(*value)["type"].isString()) {
      return ReadFileResult::INVALID_CONDITION;
    }
    auto type = (*value)["type"].asString();

    if (type == "const") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      CHECK_OK(ConstConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }

    if (type == "equals" || type == "notEquals") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
      CHECK_OK(EqualsConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notEquals") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "inList" || type == "notInList") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
      CHECK_OK(InListConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notInList") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "matches" || type == "notMatches") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
      CHECK_OK(MatchesConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notMatches") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "anyOf" || type == "allOf") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
      c->StopValue = (type == "anyOf");
      CHECK_OK(AnyAllOfConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }

    if (type == "not") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
      CHECK_OK(NotConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }
  }

  return ReadFileResult::INVALID_CONDITION;
}